

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_https.hpp
# Opt level: O2

int __thiscall
SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::accept
          (Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,int __fd,
          sockaddr *__addr,socklen_t *__addr_len)

{
  basic_socket_acceptor<asio::ip::tcp> *this_00;
  stream<asio::basic_stream_socket<asio::ip::tcp>_> *peer;
  int extraout_EAX;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
  connection;
  __shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  type local_38;
  
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::
  create_connection<asio::io_context&,asio::ssl::context&>
            ((ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>> *)&local_48,
             (io_context *)this,
             (context *)
             (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>)
             .io_service.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>).
            acceptor._M_t.
            super___uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
            .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl
  ;
  peer = ((local_48._M_ptr)->socket)._M_t.
         super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
         .
         super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_false>
         ._M_head_impl;
  local_38.this = this;
  std::
  __shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_38.connection.
                  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
                 ,&local_48);
  asio::basic_socket_acceptor<asio::ip::tcp>::
  async_accept<asio::ip::tcp,SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::accept()::_lambda(std::error_code_const&)_1_>
            (this_00,(basic_socket<asio::ip::tcp> *)peer,&local_38,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.connection.
              super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return extraout_EAX;
}

Assistant:

void accept() override {
      auto connection = create_connection(*io_service, context);

      acceptor->async_accept(connection->socket->lowest_layer(), [this, connection](const error_code &ec) {
        auto lock = connection->handler_runner->continue_lock();
        if(!lock)
          return;

        if(ec != asio::error::operation_aborted)
          this->accept();

        auto session = std::make_shared<Session>(config.max_request_streambuf_size, connection);

        if(!ec) {
          asio::ip::tcp::no_delay option(true);
          error_code ec;
          session->connection->socket->lowest_layer().set_option(option, ec);

          session->connection->set_timeout(config.timeout_request);
          session->connection->socket->async_handshake(asio::ssl::stream_base::server, [this, session](const error_code &ec) {
            session->connection->cancel_timeout();
            auto lock = session->connection->handler_runner->continue_lock();
            if(!lock)
              return;
            if(!ec)
              this->read(session);
            else if(this->on_error)
              this->on_error(session->request, ec);
          });
        }
        else if(this->on_error)
          this->on_error(session->request, ec);
      });
    }